

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxStackVariable::Emit(FxStackVariable *this,VMFunctionBuilder *build)

{
  VMFunctionBuilder *pVVar1;
  int iVar2;
  int count;
  ExpEmit local_2c;
  ExpEmit obj_1;
  int offsetreg;
  VMFunctionBuilder *build_local;
  FxStackVariable *this_local;
  ExpEmit loc;
  
  obj_1.RegNum = 0xffff;
  obj_1.RegType = 0xff;
  obj_1.RegCount = 0xff;
  unique0x100001f8 = build;
  if (this->membervar->Offset != 0) {
    obj_1._0_4_ = VMFunctionBuilder::GetConstantInt(build,(int)this->membervar->Offset);
  }
  pVVar1 = stack0xffffffffffffffe0;
  if ((this->AddressRequested & 1U) == 0) {
    iVar2 = PType::GetRegType(this->membervar->Type);
    count = PType::GetRegCount(this->membervar->Type);
    ExpEmit::ExpEmit((ExpEmit *)&this_local,pVVar1,iVar2,count);
    if (this->membervar->BitValue == -1) {
      if (obj_1._0_4_ == -1) {
        obj_1._0_4_ = VMFunctionBuilder::GetConstantInt(stack0xffffffffffffffe0,0);
      }
      pVVar1 = stack0xffffffffffffffe0;
      iVar2 = PType::GetLoadOp(this->membervar->Type);
      VMFunctionBuilder::Emit
                (pVVar1,iVar2,(uint)(ushort)this_local,
                 (uint)(stack0xffffffffffffffe0->FramePointer).RegNum,obj_1._0_4_);
    }
    else {
      ExpEmit::ExpEmit(&local_2c,stack0xffffffffffffffe0,3,1);
      if (-1 < (int)obj_1._0_4_) {
        VMFunctionBuilder::Emit
                  (stack0xffffffffffffffe0,0xcd,(uint)local_2c.RegNum,
                   (uint)(stack0xffffffffffffffe0->FramePointer).RegNum,obj_1._0_4_);
      }
      ExpEmit::Free(&local_2c,stack0xffffffffffffffe0);
      VMFunctionBuilder::Emit
                (stack0xffffffffffffffe0,0x24,(uint)(ushort)this_local,(uint)local_2c.RegNum,
                 1 << ((byte)this->membervar->BitValue & 0x1f));
    }
  }
  else if ((int)obj_1._0_4_ < 0) {
    this_local = *(FxStackVariable **)&stack0xffffffffffffffe0->FramePointer;
  }
  else {
    ExpEmit::ExpEmit((ExpEmit *)&this_local,stack0xffffffffffffffe0,3,1);
    VMFunctionBuilder::Emit
              (stack0xffffffffffffffe0,0xcd,(uint)(ushort)this_local,
               (uint)(stack0xffffffffffffffe0->FramePointer).RegNum,obj_1._0_4_);
  }
  return (ExpEmit)this_local;
}

Assistant:

ExpEmit FxStackVariable::Emit(VMFunctionBuilder *build)
{
	int offsetreg = -1;
	
	if (membervar->Offset != 0) offsetreg = build->GetConstantInt((int)membervar->Offset);

	if (AddressRequested)
	{
		if (offsetreg >= 0)
		{
			ExpEmit obj(build, REGT_POINTER);
			build->Emit(OP_ADDA_RK, obj.RegNum, build->FramePointer.RegNum, offsetreg);
			return obj;
		}
		else
		{
			return build->FramePointer;
		}
	}
	ExpEmit loc(build, membervar->Type->GetRegType(), membervar->Type->GetRegCount());

	if (membervar->BitValue == -1)
	{
		if (offsetreg == -1) offsetreg = build->GetConstantInt(0);
		build->Emit(membervar->Type->GetLoadOp(), loc.RegNum, build->FramePointer.RegNum, offsetreg);
	}
	else
	{
		ExpEmit obj(build, REGT_POINTER);
		if (offsetreg >= 0) build->Emit(OP_ADDA_RK, obj.RegNum, build->FramePointer.RegNum, offsetreg);
		obj.Free(build);
		build->Emit(OP_LBIT, loc.RegNum, obj.RegNum, 1 << membervar->BitValue);
	}
	return loc;
}